

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

SnapshotCompletionResult __thiscall
ChainstateManager::MaybeCompleteSnapshotValidation(ChainstateManager *this)

{
  int iVar1;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  bool bVar2;
  int iVar3;
  pointer pCVar4;
  Chainstate *pCVar5;
  CBlockIndex *pCVar6;
  int *piVar7;
  CBlockIndex **ppCVar8;
  uint256 *puVar9;
  size_type sVar10;
  ConstevalFormatString<1U> fmt;
  Chainstate *in_RDI;
  long in_FS_OFFSET;
  CCoinsStats *ibd_stats;
  StopHashingException *anon_var_1;
  AssumeutxoData *au_data;
  optional<AssumeutxoData> *maybe_au_data;
  CCoinsViewDB *ibd_coins_db;
  CBlockIndex *index_new;
  int curr_height;
  anon_class_24_3_af36e733 handle_invalid_snapshot;
  int snapshot_base_height;
  int snapshot_tip_height;
  optional<kernel::CCoinsStats> maybe_ibd_stats;
  uint256 snapshot_blockhash;
  undefined4 in_stack_fffffffffffffa88;
  undefined4 uVar11;
  int in_stack_fffffffffffffa8c;
  CChainParams *in_stack_fffffffffffffa90;
  char *pcVar12;
  ChainstateManager *in_stack_fffffffffffffa98;
  ChainstateManager *in_stack_fffffffffffffaa0;
  ChainstateManager *in_stack_fffffffffffffaa8;
  char *in_stack_fffffffffffffab0;
  int in_stack_fffffffffffffabc;
  CBlockIndex *in_stack_fffffffffffffac0;
  optional<uint256> *in_stack_fffffffffffffac8;
  ChainstateManager *in_stack_fffffffffffffad8;
  LogFlags in_stack_fffffffffffffaf0;
  char *flag;
  undefined8 in_stack_fffffffffffffaf8;
  int iVar13;
  ConstevalFormatString<3U> in_stack_fffffffffffffb38;
  ConstevalFormatString<0U> fmt_00;
  string_view in_stack_fffffffffffffb40;
  size_t in_stack_fffffffffffffb50;
  SnapshotCompletionResult local_494;
  Level in_stack_fffffffffffffc30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  undefined1 local_2d8 [216];
  undefined1 local_200 [439];
  undefined8 local_49;
  undefined8 local_41;
  undefined8 local_39;
  undefined8 local_31;
  long local_8;
  
  iVar13 = (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffa98,(char *)in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa8c,(AnnotatedMixin<std::recursive_mutex> *)0x7d83d0);
  pCVar4 = std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::get
                     ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                      CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
  pCVar5 = ActiveChainstate(in_stack_fffffffffffffa98);
  if (pCVar4 != pCVar5) {
    std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::get
              ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
    bVar2 = IsUsable(in_stack_fffffffffffffa98,(Chainstate *)in_stack_fffffffffffffa90);
    if (bVar2) {
      std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::get
                ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      bVar2 = IsUsable(in_stack_fffffffffffffa98,(Chainstate *)in_stack_fffffffffffffa90);
      if (bVar2) {
        std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
                  ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                   CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
        pCVar6 = CChain::Tip((CChain *)in_stack_fffffffffffffa98);
        if (pCVar6 != (CBlockIndex *)0x0) {
          ActiveHeight((ChainstateManager *)
                       CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
          GetSnapshotBaseHeight(in_stack_fffffffffffffaa0);
          inline_assertion_check<true,std::optional<int>>
                    ((optional<int> *)in_stack_fffffffffffffac8,(char *)in_stack_fffffffffffffac0,
                     in_stack_fffffffffffffabc,in_stack_fffffffffffffab0,
                     (char *)in_stack_fffffffffffffaa8);
          piVar7 = std::optional<int>::operator*
                             ((optional<int> *)
                              CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
          iVar1 = *piVar7;
          std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
                    ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                     CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
          CChain::Tip((CChain *)in_stack_fffffffffffffa98);
          ppCVar8 = inline_assertion_check<true,CBlockIndex*>
                              ((CBlockIndex **)in_stack_fffffffffffffac8,
                               (char *)in_stack_fffffffffffffac0,in_stack_fffffffffffffabc,
                               in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8);
          pCVar6 = *ppCVar8;
          if (pCVar6->nHeight < iVar1) {
            local_494 = SKIPPED;
          }
          else {
            SnapshotBlockhash(in_stack_fffffffffffffaa8);
            bVar2 = std::optional::operator_cast_to_bool
                              ((optional<uint256> *)
                               CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
            if (!bVar2) {
              __assert_fail("SnapshotBlockhash()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                            ,0x17b1,
                            "SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()"
                           );
            }
            SnapshotBlockhash(in_stack_fffffffffffffaa8);
            inline_assertion_check<true,std::optional<uint256>>
                      (in_stack_fffffffffffffac8,(char *)in_stack_fffffffffffffac0,
                       in_stack_fffffffffffffabc,in_stack_fffffffffffffab0,
                       (char *)in_stack_fffffffffffffaa8);
            puVar9 = std::optional<uint256>::operator*
                               ((optional<uint256> *)
                                CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
            local_49 = *(undefined8 *)(puVar9->super_base_blob<256U>).m_data._M_elems;
            local_41 = *(undefined8 *)((puVar9->super_base_blob<256U>).m_data._M_elems + 8);
            local_39 = *(undefined8 *)((puVar9->super_base_blob<256U>).m_data._M_elems + 0x10);
            local_31 = *(undefined8 *)((puVar9->super_base_blob<256U>).m_data._M_elems + 0x18);
            CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffffa98);
            bVar2 = ::operator!=((base_blob<256U> *)in_stack_fffffffffffffa98,
                                 (base_blob<256U> *)in_stack_fffffffffffffa90);
            if (bVar2) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
              pcVar12 = 
              "[snapshot] supposed base block %s does not match the snapshot base block %s (height %d). Snapshot is not valid.\n"
              ;
              CBlockIndex::ToString_abi_cxx11_(in_stack_fffffffffffffac0);
              base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffa90);
              uVar11 = 2;
              logging_function._M_str = (char *)pCVar6;
              logging_function._M_len = (size_t)pcVar12;
              LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,int>
                        (logging_function,in_stack_fffffffffffffb40,iVar13,in_stack_fffffffffffffaf0
                         ,in_stack_fffffffffffffc30,in_stack_fffffffffffffb38,
                         in_stack_fffffffffffffc40,in_stack_fffffffffffffc48,
                         (int *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffa8c,uVar11));
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffa8c,uVar11));
              MaybeCompleteSnapshotValidation::anon_class_24_3_af36e733::operator()
                        ((anon_class_24_3_af36e733 *)pCVar4);
              local_494 = BASE_BLOCKHASH_MISMATCH;
            }
            else {
              if (pCVar6->nHeight != iVar1) {
                __assert_fail("index_new.nHeight == snapshot_base_height",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                              ,0x17dc,
                              "SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()"
                             );
              }
              std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
                        ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                         CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
              iVar3 = CChain::Height((CChain *)
                                     CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
              if (iVar1 != iVar3) {
                __assert_fail("snapshot_base_height == curr_height",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                              ,0x17e0,
                              "SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()"
                             );
              }
              if (iVar1 != pCVar6->nHeight) {
                __assert_fail("snapshot_base_height == index_new.nHeight",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                              ,0x17e1,
                              "SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()"
                             );
              }
              std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::get
                        ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                         CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
              bVar2 = IsUsable(in_stack_fffffffffffffa98,(Chainstate *)in_stack_fffffffffffffa90);
              if (!bVar2) {
                __assert_fail("this->IsUsable(m_snapshot_chainstate.get())",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                              ,0x17e2,
                              "SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()"
                             );
              }
              GetAll(in_stack_fffffffffffffad8);
              sVar10 = std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::size
                                 ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                                  CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
              if (sVar10 != 2) {
                __assert_fail("this->GetAll().size() == 2",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                              ,0x17e3,
                              "SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()"
                             );
              }
              std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
                        ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                         in_stack_fffffffffffffa98);
              std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
                        ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                         CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
              fmt.fmt = (char *)Chainstate::CoinsDB((Chainstate *)in_stack_fffffffffffffa98);
              std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
                        ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                         CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
              Chainstate::ForceFlushStateToDisk(in_RDI);
              CChainParams::AssumeutxoForHeight
                        (in_stack_fffffffffffffa90,(int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
              bVar2 = std::optional::operator_cast_to_bool
                                ((optional<AssumeutxoData> *)
                                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
              if (bVar2) {
                std::optional<AssumeutxoData>::operator*
                          ((optional<AssumeutxoData> *)
                           CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
                std::optional<kernel::CCoinsStats>::optional
                          ((optional<kernel::CCoinsStats> *)
                           CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
                pcVar12 = 
                "[snapshot] computing UTXO stats for background chainstate to validate snapshot - this could take a few minutes\n"
                ;
                uVar11 = 2;
                logging_function_01._M_str = (char *)pCVar6;
                logging_function_01._M_len = in_stack_fffffffffffffb50;
                LogPrintFormatInternal<>
                          (logging_function_01,in_stack_fffffffffffffb40,iVar13,
                           in_stack_fffffffffffffaf0,in_stack_fffffffffffffc30,
                           (ConstevalFormatString<0U>)fmt.fmt);
                fmt_00.fmt = fmt.fmt;
                std::function<void()>::
                function<ChainstateManager::MaybeCompleteSnapshotValidation()::__0,void>
                          ((function<void_()> *)in_stack_fffffffffffffa98,
                           (anon_class_8_1_3393b503 *)pcVar12);
                kernel::ComputeUTXOStats
                          ((CoinStatsHashType)((ulong)pCVar4 >> 0x20),(CCoinsView *)in_RDI,
                           (BlockManager *)in_stack_fffffffffffffaa0,
                           (function<void_()> *)in_stack_fffffffffffffa98);
                memcpy(local_200,local_2d8,0xd8);
                std::function<void_()>::~function
                          ((function<void_()> *)CONCAT44(in_stack_fffffffffffffa8c,uVar11));
                bVar2 = std::optional::operator_cast_to_bool
                                  ((optional<kernel::CCoinsStats> *)
                                   CONCAT44(in_stack_fffffffffffffa8c,uVar11));
                if (bVar2) {
                  std::optional<kernel::CCoinsStats>::operator*
                            ((optional<kernel::CCoinsStats> *)
                             CONCAT44(in_stack_fffffffffffffa8c,uVar11));
                  AssumeutxoHash::AssumeutxoHash
                            ((AssumeutxoHash *)CONCAT44(in_stack_fffffffffffffa8c,uVar11),
                             (uint256 *)0x7d8c72);
                  bVar2 = BaseHash<uint256>::operator!=
                                    ((BaseHash<uint256> *)in_stack_fffffffffffffa98,
                                     (BaseHash<uint256> *)pcVar12);
                  if (bVar2) {
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
                    iVar13 = 0;
                    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)pcVar12);
                    BaseHash<uint256>::ToString_abi_cxx11_((BaseHash<uint256> *)pcVar12);
                    uVar11 = 2;
                    logging_function_03._M_str = (char *)pCVar6;
                    logging_function_03._M_len = in_stack_fffffffffffffb50;
                    LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                              (logging_function_03,in_stack_fffffffffffffb40,iVar13,
                               in_stack_fffffffffffffaf0,in_stack_fffffffffffffc30,
                               (ConstevalFormatString<2U>)fmt_00.fmt,in_stack_fffffffffffffc40,
                               in_stack_fffffffffffffc48);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffa8c,uVar11));
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffa8c,uVar11));
                    MaybeCompleteSnapshotValidation::anon_class_24_3_af36e733::operator()
                              ((anon_class_24_3_af36e733 *)pCVar4);
                    local_494 = HASH_MISMATCH;
                  }
                  else {
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
                    flag = "[snapshot] snapshot beginning at %s has been fully validated\n";
                    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)pcVar12);
                    uVar11 = 2;
                    logging_function_04._M_str = (char *)pCVar6;
                    logging_function_04._M_len = in_stack_fffffffffffffb50;
                    LogPrintFormatInternal<std::__cxx11::string>
                              (logging_function_04,in_stack_fffffffffffffb40,iVar13,(LogFlags)flag,
                               in_stack_fffffffffffffc30,(ConstevalFormatString<1U>)fmt_00.fmt,
                               in_stack_fffffffffffffc40);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffffa8c,uVar11));
                    pCVar4 = std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::
                             operator->((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                                        CONCAT44(in_stack_fffffffffffffa8c,uVar11));
                    pCVar4->m_disabled = true;
                    MaybeRebalanceCaches((ChainstateManager *)fmt.fmt);
                    local_494 = SUCCESS;
                  }
                }
                else {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
                  logging_function_02._M_str = (char *)pCVar6;
                  logging_function_02._M_len = in_stack_fffffffffffffb50;
                  LogPrintFormatInternal<>
                            (logging_function_02,in_stack_fffffffffffffb40,iVar13,
                             in_stack_fffffffffffffaf0,in_stack_fffffffffffffc30,fmt_00);
                  MaybeCompleteSnapshotValidation::anon_class_24_3_af36e733::operator()
                            ((anon_class_24_3_af36e733 *)pCVar4);
                  local_494 = STATS_FAILED;
                }
              }
              else {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
                logging_function_00._M_str = (char *)pCVar6;
                logging_function_00._M_len = in_stack_fffffffffffffb50;
                LogPrintFormatInternal<int>
                          (logging_function_00,in_stack_fffffffffffffb40,iVar13,
                           in_stack_fffffffffffffaf0,in_stack_fffffffffffffc30,fmt,
                           (int *)in_stack_fffffffffffffc40);
                MaybeCompleteSnapshotValidation::anon_class_24_3_af36e733::operator()
                          ((anon_class_24_3_af36e733 *)pCVar4);
                local_494 = MISSING_CHAINPARAMS;
              }
            }
          }
          goto LAB_007d8ed5;
        }
      }
    }
  }
  local_494 = SKIPPED;
LAB_007d8ed5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_494;
}

Assistant:

SnapshotCompletionResult ChainstateManager::MaybeCompleteSnapshotValidation()
{
    AssertLockHeld(cs_main);
    if (m_ibd_chainstate.get() == &this->ActiveChainstate() ||
            !this->IsUsable(m_snapshot_chainstate.get()) ||
            !this->IsUsable(m_ibd_chainstate.get()) ||
            !m_ibd_chainstate->m_chain.Tip()) {
       // Nothing to do - this function only applies to the background
       // validation chainstate.
       return SnapshotCompletionResult::SKIPPED;
    }
    const int snapshot_tip_height = this->ActiveHeight();
    const int snapshot_base_height = *Assert(this->GetSnapshotBaseHeight());
    const CBlockIndex& index_new = *Assert(m_ibd_chainstate->m_chain.Tip());

    if (index_new.nHeight < snapshot_base_height) {
        // Background IBD not complete yet.
        return SnapshotCompletionResult::SKIPPED;
    }

    assert(SnapshotBlockhash());
    uint256 snapshot_blockhash = *Assert(SnapshotBlockhash());

    auto handle_invalid_snapshot = [&]() EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        bilingual_str user_error = strprintf(_(
            "%s failed to validate the -assumeutxo snapshot state. "
            "This indicates a hardware problem, or a bug in the software, or a "
            "bad software modification that allowed an invalid snapshot to be "
            "loaded. As a result of this, the node will shut down and stop using any "
            "state that was built on the snapshot, resetting the chain height "
            "from %d to %d. On the next "
            "restart, the node will resume syncing from %d "
            "without using any snapshot data. "
            "Please report this incident to %s, including how you obtained the snapshot. "
            "The invalid snapshot chainstate will be left on disk in case it is "
            "helpful in diagnosing the issue that caused this error."),
            PACKAGE_NAME, snapshot_tip_height, snapshot_base_height, snapshot_base_height, PACKAGE_BUGREPORT
        );

        LogError("[snapshot] !!! %s\n", user_error.original);
        LogError("[snapshot] deleting snapshot, reverting to validated chain, and stopping node\n");

        m_active_chainstate = m_ibd_chainstate.get();
        m_snapshot_chainstate->m_disabled = true;
        assert(!this->IsUsable(m_snapshot_chainstate.get()));
        assert(this->IsUsable(m_ibd_chainstate.get()));

        auto rename_result = m_snapshot_chainstate->InvalidateCoinsDBOnDisk();
        if (!rename_result) {
            user_error = strprintf(Untranslated("%s\n%s"), user_error, util::ErrorString(rename_result));
        }

        GetNotifications().fatalError(user_error);
    };

    if (index_new.GetBlockHash() != snapshot_blockhash) {
        LogPrintf("[snapshot] supposed base block %s does not match the "
          "snapshot base block %s (height %d). Snapshot is not valid.\n",
          index_new.ToString(), snapshot_blockhash.ToString(), snapshot_base_height);
        handle_invalid_snapshot();
        return SnapshotCompletionResult::BASE_BLOCKHASH_MISMATCH;
    }

    assert(index_new.nHeight == snapshot_base_height);

    int curr_height = m_ibd_chainstate->m_chain.Height();

    assert(snapshot_base_height == curr_height);
    assert(snapshot_base_height == index_new.nHeight);
    assert(this->IsUsable(m_snapshot_chainstate.get()));
    assert(this->GetAll().size() == 2);

    CCoinsViewDB& ibd_coins_db = m_ibd_chainstate->CoinsDB();
    m_ibd_chainstate->ForceFlushStateToDisk();

    const auto& maybe_au_data = m_options.chainparams.AssumeutxoForHeight(curr_height);
    if (!maybe_au_data) {
        LogPrintf("[snapshot] assumeutxo data not found for height "
            "(%d) - refusing to validate snapshot\n", curr_height);
        handle_invalid_snapshot();
        return SnapshotCompletionResult::MISSING_CHAINPARAMS;
    }

    const AssumeutxoData& au_data = *maybe_au_data;
    std::optional<CCoinsStats> maybe_ibd_stats;
    LogPrintf("[snapshot] computing UTXO stats for background chainstate to validate "
        "snapshot - this could take a few minutes\n");
    try {
        maybe_ibd_stats = ComputeUTXOStats(
            CoinStatsHashType::HASH_SERIALIZED,
            &ibd_coins_db,
            m_blockman,
            [&interrupt = m_interrupt] { SnapshotUTXOHashBreakpoint(interrupt); });
    } catch (StopHashingException const&) {
        return SnapshotCompletionResult::STATS_FAILED;
    }

    // XXX note that this function is slow and will hold cs_main for potentially minutes.
    if (!maybe_ibd_stats) {
        LogPrintf("[snapshot] failed to generate stats for validation coins db\n");
        // While this isn't a problem with the snapshot per se, this condition
        // prevents us from validating the snapshot, so we should shut down and let the
        // user handle the issue manually.
        handle_invalid_snapshot();
        return SnapshotCompletionResult::STATS_FAILED;
    }
    const auto& ibd_stats = *maybe_ibd_stats;

    // Compare the background validation chainstate's UTXO set hash against the hard-coded
    // assumeutxo hash we expect.
    //
    // TODO: For belt-and-suspenders, we could cache the UTXO set
    // hash for the snapshot when it's loaded in its chainstate's leveldb. We could then
    // reference that here for an additional check.
    if (AssumeutxoHash{ibd_stats.hashSerialized} != au_data.hash_serialized) {
        LogPrintf("[snapshot] hash mismatch: actual=%s, expected=%s\n",
            ibd_stats.hashSerialized.ToString(),
            au_data.hash_serialized.ToString());
        handle_invalid_snapshot();
        return SnapshotCompletionResult::HASH_MISMATCH;
    }

    LogPrintf("[snapshot] snapshot beginning at %s has been fully validated\n",
        snapshot_blockhash.ToString());

    m_ibd_chainstate->m_disabled = true;
    this->MaybeRebalanceCaches();

    return SnapshotCompletionResult::SUCCESS;
}